

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser-test.cc
# Opt level: O0

void __thiscall ParserTest_UnindentBlock_Test::TestBody(ParserTest_UnindentBlock_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  char *in_stack_00000038;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  string *actual_expression;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  string local_38 [32];
  AssertionResult local_18;
  
  actual_expression = local_38;
  (anonymous_namespace)::Parse_abi_cxx11_(in_stack_00000038);
  testing::internal::EqHelper<false>::Compare<char[39],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (char *)actual_expression,
             (char (*) [39])CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10d314)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,(char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10d362);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d3a2);
  return;
}

Assistant:

TEST(ParserTest, UnindentBlock) {
  EXPECT_EQ("<blockquote>abc</blockquote><p>def</p>", Parse(" abc\ndef"));
}